

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RateLimiter.h
# Opt level: O2

bool __thiscall
jaegertracing::utils::RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::
checkCredit(RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock> *this,
           double itemCost)

{
  double dVar1;
  long lVar2;
  double dVar3;
  
  std::mutex::lock(&this->_mutex);
  lVar2 = _ZN13jaegertracing5utils12_GLOBAL__N_111currentTimeE_0 - (this->_lastTick).__d.__r;
  (this->_lastTick).__d.__r = _ZN13jaegertracing5utils12_GLOBAL__N_111currentTimeE_0;
  dVar3 = ((double)lVar2 / 1000000000.0) * this->_creditsPerSecond + this->_balance;
  this->_balance = dVar3;
  dVar1 = this->_maxBalance;
  if ((this->_maxBalance < dVar3) || (dVar1 = dVar3, 1.0 <= dVar3)) {
    this->_balance =
         (double)(~-(ulong)(1.0 <= dVar1) & (ulong)dVar1 |
                 (ulong)(dVar1 + -1.0) & -(ulong)(1.0 <= dVar1));
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  return 1.0 <= dVar1;
}

Assistant:

bool checkCredit(double itemCost)
    {
        std::lock_guard<std::mutex> lock(_mutex);
        const auto currentTime = Clock::now();
        const auto elapsedTime =
            std::chrono::duration<double>(currentTime - _lastTick);
        _lastTick = currentTime;

        _balance += elapsedTime.count() * _creditsPerSecond;
        if (_balance > _maxBalance) {
            _balance = _maxBalance;
        }

        if (_balance >= itemCost) {
            _balance -= itemCost;
            return true;
        }

        return false;
    }